

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O2

unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
__thiscall
duckdb::CompressedMaterialization::GetCompressExpression
          (CompressedMaterialization *this,ColumnBinding *binding,LogicalType *type,
          bool *can_compress)

{
  iterator iVar1;
  byte *in_R8;
  element_type *local_40;
  element_type *local_38;
  
  iVar1 = ::std::
          _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)binding[1].column_index,(key_type *)type);
  if (((iVar1.
        super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
        ._M_cur != (__node_type *)0x0 & *in_R8) == 1) &&
     (*(long *)((long)iVar1.
                      super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                      ._M_cur + 0x18) != 0)) {
    make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType_const&,duckdb::ColumnBinding_const&>
              ((duckdb *)&local_38,(LogicalType *)can_compress,(ColumnBinding *)type);
    unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::operator*
              ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                *)((long)iVar1.
                         super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                         ._M_cur + 0x18));
    local_40 = local_38;
    local_38 = (element_type *)0x0;
    GetCompressExpression
              (this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )binding,(BaseStatistics *)&local_40);
    if (local_40 != (element_type *)0x0) {
      (*local_40->_vptr_ExtraTypeInfo[1])();
    }
    local_40 = (element_type *)0x0;
    if (local_38 != (element_type *)0x0) {
      (*local_38->_vptr_ExtraTypeInfo[1])();
    }
  }
  else {
    this->optimizer = (Optimizer *)0x0;
  }
  return (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>)
         (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>)
         this;
}

Assistant:

unique_ptr<CompressExpression> CompressedMaterialization::GetCompressExpression(const ColumnBinding &binding,
                                                                                const LogicalType &type,
                                                                                const bool &can_compress) {
	auto it = statistics_map.find(binding);
	if (can_compress && it != statistics_map.end() && it->second) {
		auto input = make_uniq<BoundColumnRefExpression>(type, binding);
		const auto &stats = *it->second;
		return GetCompressExpression(std::move(input), stats);
	}
	return nullptr;
}